

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshCache.cpp
# Opt level: O2

IAnimatedMesh * __thiscall irr::scene::CMeshCache::getMeshByName(CMeshCache *this,path *name)

{
  uint uVar1;
  undefined1 *this_00;
  IAnimatedMesh *pIVar2;
  MeshEntry e;
  MeshEntry MStack_58;
  
  irr::io::SNamedPath::SNamedPath(&MStack_58.NamedPath,name);
  this_00 = &(this->super_IMeshCache).field_0x8;
  uVar1 = core::array<irr::scene::CMeshCache::MeshEntry>::binary_search
                    ((array<irr::scene::CMeshCache::MeshEntry> *)this_00,&MStack_58);
  if (uVar1 == 0xffffffff) {
    pIVar2 = (IAnimatedMesh *)0x0;
  }
  else {
    pIVar2 = *(IAnimatedMesh **)(*(long *)this_00 + 0x40 + (ulong)uVar1 * 0x48);
  }
  irr::io::SNamedPath::~SNamedPath(&MStack_58.NamedPath);
  return pIVar2;
}

Assistant:

IAnimatedMesh *CMeshCache::getMeshByName(const io::path &name)
{
	MeshEntry e(name);
	s32 id = Meshes.binary_search(e);
	return (id != -1) ? Meshes[id].Mesh : 0;
}